

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indicator_quad.h
# Opt level: O0

Context __thiscall
mp::
IndicatorQuadConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_1>
::Convert(IndicatorQuadConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_1>
          *this,ItemType *indc,int param_3)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  Var VVar1;
  int iVar2;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *pAVar3;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar4;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_> *in_RSI;
  AlgConRhs<1> in_RDI;
  double r;
  NodeRange NVar5;
  Var auxvar;
  QuadAndLinTerms *body;
  int binvar;
  QuadraticExpr *in_stack_fffffffffffff798;
  QuadraticFunctionalConstraint *in_stack_fffffffffffff7a0;
  QuadAndLinTerms *in_stack_fffffffffffff7a8;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffff7b0;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *this_00;
  undefined1 fSort;
  undefined4 in_stack_fffffffffffff7c0;
  int iVar6;
  undefined4 in_stack_fffffffffffff7c4;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff7c8;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *con;
  iterator pdVar7;
  undefined1 *puVar8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff800;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff808;
  AlgConRhs<1> in_stack_fffffffffffff810;
  undefined1 local_7e5 [13];
  undefined8 local_7d8;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> local_7b1 [2];
  double local_590 [55];
  undefined1 local_3d8 [940];
  Var local_2c;
  QuadAndLinTerms *local_28;
  int local_20;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_> *local_18;
  Context local_4;
  
  local_18 = in_RSI;
  local_20 = IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::
             get_binary_var(in_RSI);
  pAVar3 = IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::
           get_constraint(local_18);
  local_28 = AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::GetBody(pAVar3);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI.rhs_);
  pdVar7 = local_590;
  QuadAndLinTerms::QuadAndLinTerms
            (&in_stack_fffffffffffff7b0->super_QuadAndLinTerms,in_stack_fffffffffffff7a8);
  puVar8 = local_3d8;
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,(double)in_stack_fffffffffffff7a0);
  QuadraticFunctionalConstraint::QuadraticFunctionalConstraint
            (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  VVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AssignResultVar2Args<mp::QuadraticFunctionalConstraint>
                    (in_stack_fffffffffffff7c8,
                     (QuadraticFunctionalConstraint *)
                     CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
  QuadraticFunctionalConstraint::~QuadraticFunctionalConstraint(in_stack_fffffffffffff7a0);
  AlgebraicExpression<mp::QuadAndLinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x363bc5);
  QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_fffffffffffff7a0);
  local_2c = VVar1;
  pFVar4 = BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *)in_RDI.rhs_);
  fSort = (undefined1)((ulong)pFVar4 >> 0x38);
  iVar6 = local_20;
  iVar2 = IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::
          get_binary_value(local_18);
  local_7b1[0].super_BasicConstraint.name_._1_8_ = 0x3ff0000000000000;
  local_7b1[0].super_BasicConstraint.name_._9_8_ =
       &local_7b1[0].super_BasicConstraint.name_.field_0x1;
  local_7b1[0].super_BasicConstraint.name_.field_2._1_8_ = 1;
  con = (IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *)
        (local_7e5 + 0x34);
  std::allocator<double>::allocator((allocator<double> *)0x363c48);
  __l._M_len = (size_type)puVar8;
  __l._M_array = pdVar7;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_RDI.rhs_,__l,(allocator_type *)con);
  local_7e5._1_4_ = local_2c;
  local_7e5._5_8_ = local_7e5 + 1;
  local_7d8 = 1;
  this_00 = (IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *)
            local_7e5;
  std::allocator<int>::allocator((allocator<int> *)0x363ca8);
  __l_00._M_len = (size_type)puVar8;
  __l_00._M_array = (iterator)pdVar7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RDI.rhs_,__l_00,(allocator_type *)con);
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff810.rhs_,in_stack_fffffffffffff808,
                     in_stack_fffffffffffff800);
  pAVar3 = IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::
           get_constraint(local_18);
  r = AlgConRhs<1>::rhs(&pAVar3->super_AlgConRhs<1>);
  AlgConRhs<1>::AlgConRhs((AlgConRhs<1> *)&stack0xfffffffffffff810,r);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)con,
             (LinTerms *)CONCAT44(iVar2,iVar6),in_RDI,(bool)fSort);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
  IndicatorConstraint(this_00,(int)((ulong)in_stack_fffffffffffff7a8 >> 0x20),
                      (int)in_stack_fffffffffffff7a8,
                      (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)
                      in_stack_fffffffffffff7a0);
  NVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_RDI.rhs_,con);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
  ~IndicatorConstraint
            ((IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *)
             NVar5.ir_);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)NVar5.ir_);
  LinTerms::~LinTerms((LinTerms *)NVar5.ir_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::allocator<int>::~allocator((allocator<int> *)0x363dc5);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x363ddf);
  Context::Context(&local_4,CTX_ROOT);
  return (Context)local_4.value_;
}

Assistant:

Context Convert(const ItemType& indc, int ) {
    auto binvar=indc.get_binary_var();
    const auto& body = indc.get_constraint().GetBody();
    assert(body.is_quadratic());
    auto auxvar = GetMC().AssignResultVar2Args(  // auxvar = body + 0.0
          QuadraticFunctionalConstraint{ {body, 0.0} } );
    GetMC().AddConstraint( IndicatorLin{binvar, indc.get_binary_value(),
                                        LinCon{ { {1.0}, {auxvar} },
                                          indc.get_constraint().rhs() }} );
    return Context::CTX_ROOT;
  }